

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::VerifyMarkArena(Recycler *this,ArenaData *alloc)

{
  ArenaData::UpdateCacheBlock(alloc);
  VerifyMarkBigBlockList(this,alloc->bigBlocks);
  VerifyMarkBigBlockList(this,alloc->fullBlocks);
  VerifyMarkArenaMemoryBlockList(this,alloc->mallocBlocks);
  return;
}

Assistant:

void
Recycler::VerifyMarkArena(ArenaData * alloc)
{
    VerifyMarkBigBlockList(alloc->GetBigBlocks(false));
    VerifyMarkBigBlockList(alloc->GetFullBlocks());
    VerifyMarkArenaMemoryBlockList(alloc->GetMemoryBlocks());
}